

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name,
          FileDescriptorProto *value)

{
  bool bVar1;
  pointer ppVar2;
  LogMessage *pLVar3;
  size_type extraout_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_bool>
  pVar4;
  StringPiece name_00;
  bool local_249;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
  local_1d0;
  const_iterator local_1a8;
  LogFinisher local_199;
  LogMessage local_198;
  StringPiece local_160;
  StringPiece local_150;
  iterator local_140;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
  local_138;
  LogFinisher local_129;
  LogMessage local_128;
  StringPiece local_f0;
  StringPiece local_e0;
  _Base_ptr local_d0;
  undefined1 local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
  local_c0;
  iterator local_98;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
  local_90;
  _Self local_88;
  const_iterator iter;
  LogMessage local_70;
  StringPiece local_38;
  FileDescriptorProto *local_28;
  FileDescriptorProto *value_local;
  string *name_local;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this_local;
  
  local_28 = value;
  value_local = (FileDescriptorProto *)name;
  name_local = (string *)this;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_38,name);
  name_00.length_ = extraout_RDX;
  name_00.ptr_ = (char *)local_38.length_;
  bVar1 = anon_unknown_31::ValidateSymbolName((anon_unknown_31 *)local_38.ptr_,name_00);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_88._M_node =
         (_Base_ptr)
         (anonymous_namespace)::
         FindLastLessOrEqual<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>,std::__cxx11::string>
                   (&this->by_symbol_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_local
                   );
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
         ::end(&this->by_symbol_);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
    ::_Rb_tree_const_iterator(&local_90,&local_98);
    bVar1 = std::operator==(&local_88,&local_90);
    if (bVar1) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
      ::pair<const_google::protobuf::FileDescriptorProto_*&,_true>
                (&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_local,
                 &local_28);
      pVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
              ::insert(&this->by_symbol_,&local_c0);
      local_d0 = (_Base_ptr)pVar4.first._M_node;
      local_c8 = pVar4.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
      ::~pair(&local_c0);
      this_local._7_1_ = true;
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
               ::operator->(&local_88);
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_e0,&ppVar2->first)
      ;
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_local);
      bVar1 = anon_unknown_31::IsSubSymbol(local_e0,local_f0);
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_128,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0xdc);
        pLVar3 = internal::LogMessage::operator<<(&local_128,"Symbol name \"");
        pLVar3 = internal::LogMessage::operator<<(pLVar3,(string *)value_local);
        pLVar3 = internal::LogMessage::operator<<(pLVar3,"\" conflicts with the existing symbol \"")
        ;
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
                 ::operator->(&local_88);
        pLVar3 = internal::LogMessage::operator<<(pLVar3,&ppVar2->first);
        pLVar3 = internal::LogMessage::operator<<(pLVar3,"\".");
        internal::LogFinisher::operator=(&local_129,pLVar3);
        internal::LogMessage::~LogMessage(&local_128);
        this_local._7_1_ = false;
      }
      else {
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
        ::operator++(&local_88);
        local_140._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
             ::end(&this->by_symbol_);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
        ::_Rb_tree_const_iterator(&local_138,&local_140);
        bVar1 = std::operator!=(&local_88,&local_138);
        local_249 = false;
        if (bVar1) {
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                    (&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     value_local);
          ppVar2 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
                   ::operator->(&local_88);
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                    (&local_160,&ppVar2->first);
          local_249 = anon_unknown_31::IsSubSymbol(local_150,local_160);
        }
        if (local_249 == false) {
          local_1a8._M_node = local_88._M_node;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
          ::pair<const_google::protobuf::FileDescriptorProto_*&,_true>
                    (&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     value_local,&local_28);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
          ::insert(&this->by_symbol_,local_1a8,&local_1d0);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
          ::~pair(&local_1d0);
          this_local._7_1_ = true;
        }
        else {
          internal::LogMessage::LogMessage
                    (&local_198,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0xeb);
          pLVar3 = internal::LogMessage::operator<<(&local_198,"Symbol name \"");
          pLVar3 = internal::LogMessage::operator<<(pLVar3,(string *)value_local);
          pLVar3 = internal::LogMessage::operator<<
                             (pLVar3,"\" conflicts with the existing symbol \"");
          ppVar2 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
                   ::operator->(&local_88);
          pLVar3 = internal::LogMessage::operator<<(pLVar3,&ppVar2->first);
          pLVar3 = internal::LogMessage::operator<<(pLVar3,"\".");
          internal::LogFinisher::operator=(&local_199,pLVar3);
          internal::LogMessage::~LogMessage(&local_198);
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0xcc);
    pLVar3 = internal::LogMessage::operator<<(&local_70,"Invalid symbol name: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,(string *)value_local);
    internal::LogFinisher::operator=((LogFinisher *)((long)&iter._M_node + 3),pLVar3);
    internal::LogMessage::~LogMessage(&local_70);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddSymbol(
    const std::string& name, Value value) {
  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(name)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << name;
    return false;
  }

  // Try to look up the symbol to make sure a super-symbol doesn't already
  // exist.
  auto iter = FindLastLessOrEqual(&by_symbol_, name);

  if (iter == by_symbol_.end()) {
    // Apparently the map is currently empty.  Just insert and be done with it.
    by_symbol_.insert(
        typename std::map<std::string, Value>::value_type(name, value));
    return true;
  }

  if (IsSubSymbol(iter->first, name)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name
               << "\" conflicts with the existing "
                  "symbol \""
               << iter->first << "\".";
    return false;
  }

  // OK, that worked.  Now we have to make sure that no symbol in the map is
  // a sub-symbol of the one we are inserting.  The only symbol which could
  // be so is the first symbol that is greater than the new symbol.  Since
  // |iter| points at the last symbol that is less than or equal, we just have
  // to increment it.
  ++iter;

  if (iter != by_symbol_.end() && IsSubSymbol(name, iter->first)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name
               << "\" conflicts with the existing "
                  "symbol \""
               << iter->first << "\".";
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(
      iter, typename std::map<std::string, Value>::value_type(name, value));

  return true;
}